

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool safe_strequal(char *str1,char *str2)

{
  int iVar1;
  char *str2_local;
  char *str1_local;
  
  if ((str1 == (char *)0x0) || (str2 == (char *)0x0)) {
    str1_local._7_1_ = str1 == (char *)0x0 && str2 == (char *)0x0;
  }
  else {
    iVar1 = Curl_raw_equal(str1,str2);
    str1_local._7_1_ = iVar1 != 0;
  }
  return str1_local._7_1_;
}

Assistant:

static bool safe_strequal(char* str1, char* str2)
{
  if(str1 && str2)
    /* both pointers point to something then compare them */
    return (0 != Curl_raw_equal(str1, str2)) ? TRUE : FALSE;
  else
    /* if both pointers are NULL then treat them as equal */
    return (!str1 && !str2) ? TRUE : FALSE;
}